

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O0

_Bool i2p_eddsa_verify(uint8_t *pubkey,uint8_t *buf,size_t sz,uint8_t *sig)

{
  int iVar1;
  uchar *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  SHA512_CTX sha;
  ge_p2 R;
  ge_p3 A;
  uchar rcheck [32];
  uchar h [64];
  uchar *in_stack_00000678;
  ge_p3 *in_stack_00000680;
  uchar *in_stack_00000688;
  ge_p2 *in_stack_00000690;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  uchar *in_stack_fffffffffffffe70;
  ge_p3 *in_stack_fffffffffffffe78;
  uchar *in_stack_fffffffffffffed0;
  uchar local_88 [32];
  uchar local_68 [64];
  uchar *local_28;
  size_t local_20;
  void *local_18;
  void *local_10;
  _Bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SHA512_Init((SHA512_CTX *)&stack0xfffffffffffffd88);
  iVar1 = crypto_sign_ed25519_ref10_ge_frombytes_negate_vartime
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  if (iVar1 == 0) {
    SHA512_Update((SHA512_CTX *)&stack0xfffffffffffffd88,local_28,0x20);
    SHA512_Update((SHA512_CTX *)&stack0xfffffffffffffd88,local_10,0x20);
    SHA512_Update((SHA512_CTX *)&stack0xfffffffffffffd88,local_18,local_20);
    SHA512_Final(local_68,(SHA512_CTX *)&stack0xfffffffffffffd88);
    crypto_sign_ed25519_ref10_sc_reduce(in_stack_fffffffffffffed0);
    crypto_sign_ed25519_ref10_ge_double_scalarmult_vartime
              (in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
    crypto_sign_ed25519_ref10_ge_tobytes
              ((uchar *)in_stack_fffffffffffffe10,(ge_p2 *)in_stack_fffffffffffffe08);
    iVar1 = crypto_verify_32(local_88,local_28);
    local_1 = iVar1 == 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool i2p_eddsa_verify(const uint8_t * pubkey, const uint8_t * buf, size_t sz, const uint8_t * sig) {

  unsigned char h[64];
  unsigned char rcheck[32];
  ge_p3 A;
  ge_p2 R;
  SHA512_CTX sha;
  SHA512_Init(&sha);

  if (ge_frombytes_negate_vartime(&A,pubkey) != 0)
  {
    return false;
  }
 
  SHA512_Update(&sha,sig,32);
  SHA512_Update(&sha,pubkey, 32);
  SHA512_Update(&sha,buf,sz);
  SHA512_Final(h, &sha);
  sc_reduce(h);

  ge_double_scalarmult_vartime(&R,h,&A,sig + 32);
  ge_tobytes(rcheck,&R);
  return crypto_verify_32(rcheck, sig) == 0;
}